

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::forEachImage
          (QPDFPageObjectHelper *this,bool recursive,
          function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action)

{
  anon_class_1_0_00000001 local_61;
  function<bool_(QPDFObjectHandle)> local_60;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_20;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *action_local;
  QPDFPageObjectHelper *pQStack_10;
  bool recursive_local;
  QPDFPageObjectHelper *this_local;
  
  local_20 = action;
  action_local._7_1_ = recursive;
  pQStack_10 = this;
  std::
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_40,action);
  std::function<bool(QPDFObjectHandle)>::
  function<QPDFPageObjectHelper::forEachImage(bool,std::function<void(QPDFObjectHandle&,QPDFObjectHandle&,std::__cxx11::string_const&)>)::__0,void>
            ((function<bool(QPDFObjectHandle)> *)&local_60,&local_61);
  forEachXObject(this,recursive,&local_40,&local_60);
  std::function<bool_(QPDFObjectHandle)>::~function(&local_60);
  std::
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  return;
}

Assistant:

void
QPDFPageObjectHelper::forEachImage(
    bool recursive,
    std::function<void(QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key)>
        action)
{
    forEachXObject(recursive, action, [](QPDFObjectHandle obj) { return obj.isImage(); });
}